

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Entity_State_PDU::ResetDeadReckoning(Entity_State_PDU *this)

{
  DeadReckoningCalculator *this_00;
  DeadReckoningAlgorithm DRA;
  Vector *LinearAcceleration;
  Vector *AngularVelocity;
  DeadReckoningParameter *this_01;
  Vector local_28;
  Entity_State_PDU *local_10;
  Entity_State_PDU *this_local;
  
  if (this->m_pDrCalc != (DeadReckoningCalculator *)0x0) {
    this_00 = this->m_pDrCalc;
    this_01 = &this->m_DeadReckoningParameter;
    local_10 = this;
    LinearAcceleration = DATA_TYPE::DeadReckoningParameter::GetLinearAcceleration(this_01);
    AngularVelocity = DATA_TYPE::DeadReckoningParameter::GetAngularVelocity(this_01);
    DATA_TYPE::DeadReckoningParameter::GetQuatAxis(&local_28,this_01);
    DRA = DATA_TYPE::DeadReckoningParameter::GetDeadReckoningAlgorithm(this_01);
    UTILS::DeadReckoningCalculator::Reset
              (this_00,&this->m_EntityLinearVelocity,LinearAcceleration,AngularVelocity,
               &this->m_EntityLocation,&this->m_EntityOrientation,&local_28,DRA);
    DATA_TYPE::Vector::~Vector(&local_28);
  }
  return;
}

Assistant:

void Entity_State_PDU::ResetDeadReckoning()
{
    if( m_pDrCalc )
    {
        m_pDrCalc->Reset( m_EntityLinearVelocity, m_DeadReckoningParameter.GetLinearAcceleration(), m_DeadReckoningParameter.GetAngularVelocity(),
                          m_EntityLocation, m_EntityOrientation, m_DeadReckoningParameter.GetQuatAxis(), m_DeadReckoningParameter.GetDeadReckoningAlgorithm() );
    }
}